

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

int isequal(attr *a,attr *b)

{
  int *piVar1;
  int *piVar2;
  array_t *paVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int d2 [10];
  int d1 [10];
  
  if (b != (attr *)0x0 && a != (attr *)0x0) {
    lVar5 = 0;
    while (iVar4 = a->kind, iVar4 == 1) {
      paVar3 = (a->field_1).array;
      d1[lVar5] = paVar3->size;
      lVar5 = lVar5 + 1;
      a = paVar3->type;
    }
    lVar7 = 0;
    while (iVar6 = b->kind, iVar6 == 1) {
      paVar3 = (b->field_1).array;
      d2[lVar7] = paVar3->size;
      lVar7 = lVar7 + 1;
      b = paVar3->type;
    }
    if (lVar5 == lVar7) {
      lVar7 = 0;
      do {
        if (lVar5 == lVar7) {
          if (iVar4 == 3) {
            a = ((a->field_1).function)->return_type;
          }
          if (iVar6 == 3) {
            b = ((b->field_1).function)->return_type;
            iVar6 = b->kind;
          }
          if (a->kind != iVar6) {
            return 0;
          }
          switch(iVar6) {
          case 0:
            if (((a->field_1).basic)->type != ((b->field_1).basic)->type) {
              return 0;
            }
            break;
          case 1:
          case 3:
            break;
          case 2:
            iVar4 = strcmp(((a->field_1).basic)->name,((b->field_1).basic)->name);
            if (iVar4 != 0) {
              return 0;
            }
            break;
          default:
            abort();
          }
          return 1;
        }
        piVar2 = d1 + lVar7;
        piVar1 = d2 + lVar7;
        lVar7 = lVar7 + 1;
      } while (*piVar2 == *piVar1);
    }
  }
  return 0;
}

Assistant:

static int isequal(struct attr *a, struct attr *b) {
    if (!a || !b)
        return 0;
    int d1[10], d2[10];
    int depth1 = 0, depth2 = 0;
    for (; a->kind == ARRAY; ++depth1) {
        d1[depth1] = a->array->size;
        a = a->array->type;
    }
    for (; b->kind == ARRAY; ++depth2) {
        d2[depth2] = b->array->size;
        b = b->array->type;
    }
    if (depth1 != depth2)
        return 0;
    int i;
    for (i = 0; i < depth1; ++i) {
        if (d1[i] != d2[i])
            return 0;
    }
    if (a->kind == FUNCTION)
        a = a->function->return_type;
    if (b->kind == FUNCTION) {
        b = b->function->return_type;
    }
    //DONETODO: check type equality
    if (a->kind != b->kind)
        return 0;
    switch (a->kind) {
        case BASIC:
            if (a->basic->type != b->basic->type)
                return 0;
            break;
        case STRUCTURE:
            if (strcmp(a->structure->name, b->structure->name) != 0) {
                return 0;
            }
            break;
        case ARRAY:
            break;
        case FUNCTION:
            break;
        default:
            abort();
    }
    return 1;
}